

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

uint128 __thiscall
absl::lts_20250127::anon_unknown_1::MakeU128Ticks(anon_unknown_1 *this,Duration d)

{
  uint uVar1;
  uint128 uVar2;
  uint128 other;
  uint128 local_28;
  
  uVar1 = 4000000000 - d.rep_hi_.lo_;
  if (-1 < (long)this) {
    uVar1 = d.rep_hi_.lo_;
  }
  local_28.lo_ = (long)this >> 0x3f ^ (ulong)this;
  local_28.hi_ = 0;
  other.hi_._4_4_ = 0;
  other._0_12_ = ZEXT812(4000000000);
  uint128::operator*=(&local_28,other);
  uVar2.hi_ = local_28.hi_ + CARRY8((ulong)uVar1,local_28.lo_);
  uVar2.lo_ = uVar1 + local_28.lo_;
  return uVar2;
}

Assistant:

inline uint128 MakeU128Ticks(Duration d) {
  int64_t rep_hi = time_internal::GetRepHi(d);
  uint32_t rep_lo = time_internal::GetRepLo(d);
  if (rep_hi < 0) {
    ++rep_hi;
    rep_hi = -rep_hi;
    rep_lo = kTicksPerSecond - rep_lo;
  }
  uint128 u128 = static_cast<uint64_t>(rep_hi);
  u128 *= static_cast<uint64_t>(kTicksPerSecond);
  u128 += rep_lo;
  return u128;
}